

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

SQInteger __thiscall SQBlob::Read(SQBlob *this,void *buffer,SQInteger size)

{
  bool bVar1;
  size_t local_30;
  SQInteger n;
  SQInteger size_local;
  void *buffer_local;
  SQBlob *this_local;
  
  bVar1 = CanAdvance(this,size);
  local_30 = size;
  if (!bVar1) {
    if (this->_size - this->_ptr < 1) {
      return 0;
    }
    local_30 = this->_size - this->_ptr;
  }
  memcpy(buffer,this->_buf + this->_ptr,local_30);
  this->_ptr = local_30 + this->_ptr;
  return local_30;
}

Assistant:

SQInteger Read(void *buffer,SQInteger size) {
        SQInteger n = size;
        if(!CanAdvance(size)) {
            if((_size - _ptr) > 0)
                n = _size - _ptr;
            else return 0;
        }
        memcpy(buffer, &_buf[_ptr], n);
        _ptr += n;
        return n;
    }